

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenMemoryInitSetDest(BinaryenExpressionRef expr,BinaryenExpressionRef destExpr)

{
  if (expr->_id != MemoryInitId) {
    __assert_fail("expression->is<MemoryInit>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xdb1,
                  "void BinaryenMemoryInitSetDest(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (destExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = destExpr;
    return;
  }
  __assert_fail("destExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xdb2,
                "void BinaryenMemoryInitSetDest(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenMemoryInitSetDest(BinaryenExpressionRef expr,
                               BinaryenExpressionRef destExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryInit>());
  assert(destExpr);
  static_cast<MemoryInit*>(expression)->dest = (Expression*)destExpr;
}